

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:205:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:205:17)>
            *this)

{
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  undefined1 local_90 [56];
  char *pcStack_58;
  undefined8 local_50;
  Own<capnp::RequestHook,_std::nullptr_t> local_38;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            ((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
              *)(local_90 + 0x30),&((this->f).env)->membraned,&local_28);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
          *)local_90,(int)local_90 + 0x30,__buf,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Pipeline::getThing
            (__return_storage_ptr__,(Pipeline *)(local_90 + 8));
  capnp::RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *)local_90)
  ;
  Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_38);
  capnp::Capability::Client::whenResolved((Client *)local_90);
  local_90._48_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcStack_58 = "operator()";
  local_50 = 0x5000000cf;
  Promise<void>::wait((Promise<void> *)local_90,&((this->f).env)->waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }